

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O1

UMutableCPTrie * umutablecptrie_clone_63(UMutableCPTrie *other,UErrorCode *pErrorCode)

{
  int iVar1;
  MutableCodePointTrie *this;
  uint32_t *puVar2;
  uint32_t *puVar3;
  UErrorCode *__src;
  MutableCodePointTrie *pMVar4;
  uint uVar5;
  
  pMVar4 = (MutableCodePointTrie *)0x0;
  if ((other != (UMutableCPTrie *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    __src = pErrorCode;
    this = (MutableCodePointTrie *)
           icu_63::UMemory::operator_new((UMemory *)0x11040,(size_t)pErrorCode);
    if (this == (MutableCodePointTrie *)0x0) {
      this = (MutableCodePointTrie *)0x0;
    }
    else {
      this->index = (uint32_t *)0x0;
      this->indexCapacity = 0;
      this->index3NullOffset = *(int32_t *)(other + 0xc);
      this->data = (uint32_t *)0x0;
      this->dataCapacity = 0;
      this->dataLength = 0;
      this->dataNullOffset = *(int32_t *)(other + 0x20);
      this->origInitialValue = *(uint32_t *)(other + 0x24);
      this->initialValue = *(uint32_t *)(other + 0x28);
      this->errorValue = *(uint32_t *)(other + 0x2c);
      iVar1 = *(int *)(other + 0x30);
      this->highStart = iVar1;
      this->highValue = *(uint32_t *)(other + 0x34);
      this->index16 = (uint16_t *)0x0;
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        uVar5 = (uint)(0x10000 < iVar1);
        puVar2 = (uint32_t *)uprv_malloc_63((ulong)(uVar5 * 0x40000 + 0x4000));
        this->index = puVar2;
        puVar3 = (uint32_t *)uprv_malloc_63((long)*(int *)(other + 0x18) << 2);
        this->data = puVar3;
        puVar2 = this->index;
        if ((puVar2 == (uint32_t *)0x0) || (puVar3 == (uint32_t *)0x0)) {
          *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          this->indexCapacity = uVar5 * 0x10000 | 0x1000;
          this->dataCapacity = *(int32_t *)(other + 0x18);
          iVar1 = this->highStart >> 4;
          memcpy(this->flags,other + 0x40,(long)iVar1);
          memcpy(puVar2,*(void **)other,(long)(iVar1 << 2));
          __src = *(UErrorCode **)(other + 0x10);
          memcpy(this->data,__src,(long)*(int *)(other + 0x1c) << 2);
          this->dataLength = *(int32_t *)(other + 0x1c);
        }
      }
    }
    if ((this == (MutableCodePointTrie *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    pMVar4 = (MutableCodePointTrie *)0x0;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pMVar4 = this;
    }
    if (this != (MutableCodePointTrie *)0x0 && U_ZERO_ERROR < *pErrorCode) {
      icu_63::anon_unknown_0::MutableCodePointTrie::~MutableCodePointTrie(this);
      icu_63::UMemory::operator_delete((UMemory *)this,__src);
    }
  }
  return (UMutableCPTrie *)pMVar4;
}

Assistant:

U_CAPI UMutableCPTrie * U_EXPORT2
umutablecptrie_clone(const UMutableCPTrie *other, UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) {
        return nullptr;
    }
    if (other == nullptr) {
        return nullptr;
    }
    LocalPointer<MutableCodePointTrie> clone(
        new MutableCodePointTrie(*reinterpret_cast<const MutableCodePointTrie *>(other), *pErrorCode), *pErrorCode);
    if (U_FAILURE(*pErrorCode)) {
        return nullptr;
    }
    return reinterpret_cast<UMutableCPTrie *>(clone.orphan());
}